

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_callmsg.c
# Opt level: O2

_Bool xdr_call_decode(XDR *xdrs,rpc_msg *cmsg,int32_t *buf)

{
  uint uVar1;
  uint *puVar2;
  _Bool _Var3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  if (buf == (int32_t *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u non-INLINE","xdr_call_decode",0xcb);
    }
    _Var3 = xdr_getuint32(xdrs,(uint32_t *)&cmsg->ru);
    if (!_Var3) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar6 = "%s:%u ERROR rm_call.cb_rpcvers";
      uVar5 = 0xcf;
      goto LAB_0010f7c9;
    }
    uVar4 = (cmsg->ru).RM_cmb.cb_rpcvers;
    if (uVar4 != 2) goto LAB_0010f6bb;
    _Var3 = xdr_getuint32(xdrs,&cmsg->cb_prog);
    if (!_Var3) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar6 = "%s:%u ERROR cb_prog";
      uVar5 = 0xe2;
      goto LAB_0010f7c9;
    }
    _Var3 = xdr_getuint32(xdrs,&cmsg->cb_vers);
    if (!_Var3) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar6 = "%s:%u ERROR cb_vers";
      uVar5 = 0xe7;
      goto LAB_0010f7c9;
    }
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u INLINE","xdr_call_decode",0xc6);
    }
    uVar1 = *buf;
    uVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    (cmsg->ru).RM_cmb.cb_rpcvers = uVar4;
    if (uVar1 != 0x2000000) {
LAB_0010f6bb:
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR rm_call.cb_rpcvers %u != %u","xdr_call_decode",0xd6,(ulong)uVar4,2);
      return false;
    }
    uVar4 = buf[1];
    cmsg->cb_prog = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar4 = buf[2];
    cmsg->cb_vers = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  }
  puVar2 = (uint *)xdrs->x_data;
  if (((xdrs->x_v).vio_tail < puVar2 + 3) ||
     (xdrs->x_data = (uint8_t *)(puVar2 + 3), puVar2 == (uint *)0x0)) {
    _Var3 = xdr_getuint32(xdrs,&cmsg->cb_proc);
    if (!_Var3) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar6 = "%s:%u ERROR cb_proc";
      uVar5 = 0xf7;
      goto LAB_0010f7c9;
    }
    _Var3 = xdr_opaque_auth_decode(xdrs,&cmsg->cb_cred,(int32_t *)0x0);
    if (!_Var3) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar6 = "%s:%u ERROR (return)";
      uVar5 = 0xfc;
      goto LAB_0010f7c9;
    }
  }
  else {
    uVar4 = *puVar2;
    cmsg->cb_proc = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    _Var3 = xdr_opaque_auth_decode(xdrs,&cmsg->cb_cred,(int32_t *)(puVar2 + 1));
    if (!_Var3) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar6 = "%s:%u ERROR (return)";
      uVar5 = 0xf1;
      goto LAB_0010f7c9;
    }
  }
  _Var3 = xdr_opaque_auth_decode(xdrs,&cmsg->cb_verf,(int32_t *)0x0);
  if (_Var3) {
    return true;
  }
  if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
    return false;
  }
  pcVar6 = "%s:%u ERROR (return)";
  uVar5 = 0x103;
LAB_0010f7c9:
  (*__ntirpc_pkg_params.warnx_)(pcVar6,"xdr_call_decode",uVar5);
  return false;
}

Assistant:

bool
xdr_call_decode(XDR *xdrs, struct rpc_msg *cmsg, int32_t *buf)
{
	if (buf != NULL) {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u INLINE",
			__func__, __LINE__);
		cmsg->rm_call.cb_rpcvers = IXDR_GET_U_INT32(buf);
	} else {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u non-INLINE",
			__func__, __LINE__);
		if (!xdr_getuint32(xdrs, &cmsg->rm_call.cb_rpcvers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers",
				__func__, __LINE__);
			return (false);
		}
	}
	if (cmsg->rm_call.cb_rpcvers != RPC_MSG_VERSION) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR rm_call.cb_rpcvers %u != %u",
			__func__, __LINE__,
			cmsg->rm_call.cb_rpcvers,
			RPC_MSG_VERSION);
		return (false);
	}

	if (buf != NULL) {
		cmsg->cb_prog = IXDR_GET_U_INT32(buf);
		cmsg->cb_vers = IXDR_GET_U_INT32(buf);
	} else if (!xdr_getuint32(xdrs, &(cmsg->cb_prog))) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_prog",
			__func__, __LINE__);
		return (false);
	} else if (!xdr_getuint32(xdrs, &(cmsg->cb_vers))) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_vers",
			__func__, __LINE__);
		return (false);
	}

	buf = xdr_inline_decode(xdrs, 3 * BYTES_PER_XDR_UNIT);
	if (buf != NULL) {
		cmsg->cb_proc = IXDR_GET_U_INT32(buf);
		if (!xdr_opaque_auth_decode(xdrs, &(cmsg->cb_cred), buf)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}
	} else if (!xdr_getuint32(xdrs, &(cmsg->cb_proc))) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_proc",
			__func__, __LINE__);
		return (false);
	} else if (!xdr_opaque_auth_decode(xdrs, &(cmsg->cb_cred), NULL)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR (return)",
			__func__, __LINE__);
		return (false);
	}

	if (!xdr_opaque_auth_decode(xdrs, &(cmsg->cb_verf), NULL)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR (return)",
			__func__, __LINE__);
		return (false);
	}
	return (true);
}